

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getconf.cc
# Opt level: O2

result_t * getconfFunc(result_t *__return_storage_ptr__,Env *env,GetconfArgument *args)

{
  int iVar1;
  result_t *this;
  Env *pEVar2;
  ostream *poVar3;
  runtime_error *this_00;
  int iVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int DBASE_MAXITEM;
  int DBASE_NUM_TRANS;
  int custid;
  float DBASE_AVG_TRANS_SZ;
  int DBASE_NUM_CUST;
  int nitem;
  float DBASE_AVG_CUST_SZ;
  int DBASE_MAXTRANS;
  int DBASE_MINTRANS;
  GetconfArgument *local_2b0;
  int tid;
  result_t *local_2a0;
  int *buf;
  double local_290;
  Env *local_288;
  string error_message;
  DbaseCtrlBlk dcb;
  ofstream conffd;
  byte abStack_210 [480];
  
  DBASE_NUM_TRANS = 0;
  DBASE_MAXITEM = 0;
  DBASE_NUM_CUST = 0;
  DBASE_MINTRANS = 0;
  DBASE_MAXTRANS = 0;
  DBASE_AVG_TRANS_SZ = 0.0;
  DBASE_AVG_CUST_SZ = 0.0;
  custid = 0;
  tid = 0;
  nitem = 0;
  buf = (int *)0x0;
  local_2b0 = args;
  local_2a0 = __return_storage_ptr__;
  local_288 = env;
  DbaseCtrlBlk::init(&dcb,(EVP_PKEY_CTX *)args);
  DbaseCtrlBlk::get_first_blk(&dcb);
  DbaseCtrlBlk::get_next_trans(&dcb,&buf,&nitem,&tid,&custid);
  DBASE_MINTRANS = custid;
  iVar13 = -1;
  iVar12 = 0;
  iVar4 = 0;
  iVar10 = 0;
  iVar11 = 0;
  iVar5 = 0;
  while (dcb.readall != '\x01') {
    DBASE_MAXTRANS = custid;
    if ((iVar13 != custid & local_2b0->use_seq) == 1) {
      DBASE_NUM_CUST = DBASE_NUM_CUST + 1;
      iVar10 = (iVar10 - iVar12) + DBASE_NUM_TRANS;
      iVar12 = DBASE_NUM_TRANS;
      iVar13 = custid;
    }
    DBASE_NUM_TRANS = DBASE_NUM_TRANS + 1;
    iVar4 = iVar4 + nitem;
    uVar8 = 0;
    if (0 < nitem) {
      uVar8 = (ulong)(uint)nitem;
    }
    iVar6 = DBASE_MAXITEM;
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      iVar1 = buf[uVar9];
      if (iVar6 < iVar1) {
        iVar6 = iVar1;
        DBASE_MAXITEM = iVar1;
      }
    }
    if (iVar5 < nitem) {
      iVar5 = nitem;
    }
    iVar11 = iVar11 + nitem * nitem;
    DbaseCtrlBlk::get_next_trans(&dcb,&buf,&nitem,&tid,&custid);
  }
  DBASE_MAXITEM = DBASE_MAXITEM + 1;
  if (local_2b0->use_seq == true) {
    DBASE_AVG_CUST_SZ = (float)((iVar10 - iVar12) + DBASE_NUM_TRANS) / (float)DBASE_NUM_CUST;
  }
  DBASE_AVG_TRANS_SZ = (float)((double)iVar4 / (double)DBASE_NUM_TRANS);
  local_290 = (double)iVar11 / (double)DBASE_NUM_TRANS -
              (double)(DBASE_AVG_TRANS_SZ * DBASE_AVG_TRANS_SZ);
  if (local_290 < 0.0) {
    local_290 = sqrt(local_290);
  }
  else {
    local_290 = SQRT(local_290);
  }
  pEVar2 = local_288;
  this = local_2a0;
  std::ofstream::ofstream(&conffd,(local_2b0->confn)._M_dataplus._M_p,_S_out|_S_bin);
  if ((abStack_210[*(long *)(_conffd + -0x18)] & 5) == 0) {
    if (local_2b0->use_seq == true) {
      std::ostream::write((char *)&conffd,(long)&DBASE_NUM_CUST);
      std::ostream::write((char *)&conffd,(long)&DBASE_MAXITEM);
      std::ostream::write((char *)&conffd,(long)&DBASE_AVG_CUST_SZ);
      std::ostream::write((char *)&conffd,(long)&DBASE_AVG_TRANS_SZ);
      pfVar7 = (float *)&DBASE_NUM_TRANS;
    }
    else {
      std::ostream::write((char *)&conffd,(long)&DBASE_NUM_TRANS);
      std::ostream::write((char *)&conffd,(long)&DBASE_MAXITEM);
      pfVar7 = &DBASE_AVG_TRANS_SZ;
    }
    std::ostream::write((char *)&conffd,(long)pfVar7);
    std::ostream::write((char *)&conffd,(long)&DBASE_MINTRANS);
    std::ostream::write((char *)&conffd,(long)&DBASE_MAXTRANS);
    std::ofstream::close();
    poVar3 = std::operator<<((ostream *)&pEVar2->summary,"CONF ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,DBASE_NUM_CUST);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,DBASE_MAXITEM);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,DBASE_AVG_CUST_SZ);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,DBASE_AVG_TRANS_SZ);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,DBASE_NUM_TRANS);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,DBASE_MINTRANS);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,DBASE_MAXTRANS);
    std::operator<<(poVar3," ");
    poVar3 = std::ostream::_M_insert<double>(local_290);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    result_t::result_t(this);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->logger,(string *)&error_message);
    std::__cxx11::string::~string((string *)&error_message);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->summary,(string *)&error_message);
    std::__cxx11::string::~string((string *)&error_message);
    std::ofstream::~ofstream(&conffd);
    DbaseCtrlBlk::~DbaseCtrlBlk(&dcb);
    return this;
  }
  std::operator+(&error_message,"can\'t open file: ",&local_2b0->confn);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)&error_message);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

result_t getconfFunc(Env& env, const GetconfArgument& args) {
    int DBASE_NUM_TRANS = 0;
    int DBASE_MAXITEM = 0;
    int DBASE_NUM_CUST = 0;
    int DBASE_MINTRANS = 0;
    int DBASE_MAXTRANS = 0;
    float DBASE_AVG_TRANS_SZ = 0;
    float DBASE_AVG_CUST_SZ = 0;

    int i;

    int custid = 0, tid = 0, nitem = 0;
    int *buf = nullptr;
    int oldcustid = -1;
    int oldtcnt = 0;
    int tsizesum = 0;
    int tcustsum = 0;
    int tsizesq = 0;
    int maxnitem = 0;

    DbaseCtrlBlk dcb;
    dcb.init(args.input);

    dcb.get_first_blk();
    dcb.get_next_trans(buf, nitem, tid, custid);
    DBASE_MINTRANS = custid;
    while (!dcb.eof()) {
        //printf ("%d %d %d\n", custid, tid, nitem);
        DBASE_MAXTRANS = custid;
        if (args.use_seq) {
            if (oldcustid != custid) {
                tcustsum += DBASE_NUM_TRANS - oldtcnt;
                oldtcnt = DBASE_NUM_TRANS;
                DBASE_NUM_CUST++;
                oldcustid = custid;
            }
        }
        DBASE_NUM_TRANS++;
        tsizesum += nitem;
        if (nitem > maxnitem) maxnitem = nitem;

        tsizesq += (nitem * nitem);
        for (i = 0; i < nitem; i++)
            if (buf[i] > DBASE_MAXITEM) DBASE_MAXITEM = buf[i];
        dcb.get_next_trans(buf, nitem, tid, custid);
    }
    tcustsum += DBASE_NUM_TRANS - oldtcnt;
    DBASE_MAXITEM++;

    if (args.use_seq) {
        DBASE_AVG_CUST_SZ = (1.0 * tcustsum) / DBASE_NUM_CUST;
    }
    DBASE_AVG_TRANS_SZ = (1.0 * tsizesum) / DBASE_NUM_TRANS;
    double trans_sq_avg = (1.0 * tsizesq) / DBASE_NUM_TRANS;
    double stddev = sqrt(trans_sq_avg - (DBASE_AVG_TRANS_SZ * DBASE_AVG_TRANS_SZ));


    //write config info to new file
    ofstream conffd(args.confn.c_str(), ios::binary | ios::out);

    if (!conffd) {
        string error_message = "can't open file: " + args.confn;
        throw runtime_error(error_message);
    }

    if (args.use_seq) {
        conffd.write((char *) &DBASE_NUM_CUST, INT_SIZE);
        conffd.write((char *) &DBASE_MAXITEM, INT_SIZE);
        conffd.write((char *) &DBASE_AVG_CUST_SZ, sizeof(float));
        conffd.write((char *) &DBASE_AVG_TRANS_SZ, sizeof(float));
        conffd.write((char *) &DBASE_NUM_TRANS, INT_SIZE);
        conffd.write((char *) &DBASE_MINTRANS, INT_SIZE);
        conffd.write((char *) &DBASE_MAXTRANS, INT_SIZE);
    } else {
        conffd.write((char *) &DBASE_NUM_TRANS, INT_SIZE);
        conffd.write((char *) &DBASE_MAXITEM, INT_SIZE);
        conffd.write((char *) &DBASE_AVG_TRANS_SZ, sizeof(float));
        conffd.write((char *) &DBASE_MINTRANS, INT_SIZE);
        conffd.write((char *) &DBASE_MAXTRANS, INT_SIZE);
    }

    conffd.close();
    env.summary << "CONF " << DBASE_NUM_CUST << " " << DBASE_MAXITEM << " " << DBASE_AVG_CUST_SZ
            << " " << DBASE_AVG_TRANS_SZ << " " << DBASE_NUM_TRANS << " " << DBASE_MINTRANS
            << " " << DBASE_MAXTRANS << " " << stddev << " " << maxnitem << endl;

    result_t result;
    result.logger = env.logger.str();
    result.summary = env.summary.str();
    return result;
}